

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp_client.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  id iVar1;
  uint16_t p;
  typed_value<unsigned_short,_char> *ptVar2;
  char *pcVar3;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar4;
  size_type sVar5;
  ostream *this;
  time_t tVar6;
  variable_value *pvVar7;
  unsigned_short *puVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *host;
  basic_resolver_entry<boost::asio::ip::udp> *pbVar9;
  type local_5f0;
  thread local_5e8;
  thread worker;
  function<void_()> local_5d0;
  anon_class_8_1_54a39813 local_5b0;
  function<void_(bool,_unsigned_int)> local_5a8;
  endpoint_type local_588;
  allocator<char> local_569;
  string local_568 [8];
  string a;
  sender s;
  function<void_(rudp::rudp_server_&,_unsigned_int,_const_std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>_&)>
  local_518;
  allocator<char> local_4f1;
  string local_4f0;
  undefined1 local_4d0 [8];
  rudp_server server;
  vector<unsigned_char,_std::allocator<unsigned_char>_> received;
  undefined1 local_3c0 [8];
  basic_resolver_entry<boost::asio::ip::udp> remote_endpoint;
  string local_358;
  undefined1 local_338 [8];
  query query;
  string local_2c0;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a0;
  undefined1 local_298 [8];
  string port_name;
  resolver resolver;
  io_service io_service;
  key_type local_218;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1f8;
  basic_parsed_options<char> local_1d0;
  variables_map local_1a8 [8];
  variables_map values;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_198 [151];
  allocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  unsigned_short local_dc [2];
  undefined8 local_d8 [3];
  allocator<char> local_b9;
  string local_b8 [32];
  options_description local_98 [8];
  options_description opts;
  char **argv_local;
  int argc_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"Options",&local_b9);
  boost::program_options::options_description::options_description
            (local_98,local_b8,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  local_d8[0] = boost::program_options::options_description::add_options();
  ptVar2 = boost::program_options::value<unsigned_short>();
  local_dc[1] = 8000;
  ptVar2 = boost::program_options::typed_value<unsigned_short,_char>::default_value
                     (ptVar2,local_dc + 1);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)local_d8,(value_semantic *)"remote_port,r",(char *)ptVar2);
  ptVar2 = boost::program_options::value<unsigned_short>();
  local_dc[0] = 0x1f41;
  ptVar2 = boost::program_options::typed_value<unsigned_short,_char>::default_value(ptVar2,local_dc)
  ;
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"self_port,s",(char *)ptVar2);
  ptVar4 = boost::program_options::value<std::__cxx11::string>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"localhost",&local_101);
  ptVar4 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar4,&local_100);
  pcVar3 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar3,(value_semantic *)"host,H",(char *)ptVar4);
  boost::program_options::options_description_easy_init::operator()(pcVar3,"help,h");
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  boost::program_options::variables_map::variables_map(local_1a8);
  local_1f8.super_function_base.functor._8_8_ = 0;
  local_1f8.super_function_base.functor._16_8_ = 0;
  local_1f8.super_function_base.vtable = (vtable_base *)0x0;
  local_1f8.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::function1(&local_1f8);
  boost::program_options::parse_command_line<char>(&local_1d0,argc,argv,local_98,0,&local_1f8);
  boost::program_options::store((basic_parsed_options *)&local_1d0,local_1a8,false);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options(&local_1d0);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"help",(allocator<char> *)((long)&io_service.impl_ + 7));
  sVar5 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_198,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)((long)&io_service.impl_ + 7));
  if (sVar5 == 0) {
    tVar6 = time((time_t *)0x0);
    srand((uint)tVar6);
    boost::asio::io_context::io_context((io_context *)&resolver.impl_.executor_.prop_fns_);
    boost::asio::ip::
    basic_resolver<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::basic_resolver<boost::asio::io_context>
              ((basic_resolver<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)((long)&port_name.field_2 + 8),(io_context *)&resolver.impl_.executor_.prop_fns_,
               (type *)0x0);
    std::__cxx11::string::string((string *)local_298);
    local_2a0 = std::back_inserter<std::__cxx11::string>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_298);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"remote_port",
               (allocator<char> *)(query.service_name_.field_2._M_local_buf + 0xf));
    pvVar7 = boost::program_options::variables_map::operator[](local_1a8,&local_2c0);
    puVar8 = boost::program_options::variable_value::as<unsigned_short>(pvVar7);
    boost::spirit::karma::
    generate<std::back_insert_iterator<std::__cxx11::string>,boost::spirit::terminal<boost::spirit::tag::ushort_>,unsigned_short>
              (&local_2a0,(terminal<boost::spirit::tag::ushort_> *)&boost::spirit::ushort_,puVar8);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::allocator<char>::~allocator
              ((allocator<char> *)(query.service_name_.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_358,"host",
               (allocator<char> *)(remote_endpoint.service_name_.field_2._M_local_buf + 0xf));
    pvVar7 = boost::program_options::variables_map::operator[](local_1a8,&local_358);
    host = boost::program_options::variable_value::as<std::__cxx11::string>(pvVar7);
    boost::asio::ip::basic_resolver_query<boost::asio::ip::udp>::basic_resolver_query
              ((basic_resolver_query<boost::asio::ip::udp> *)local_338,host,(string *)local_298,
               address_configured);
    std::__cxx11::string::~string((string *)&local_358);
    std::allocator<char>::~allocator
              ((allocator<char> *)(remote_endpoint.service_name_.field_2._M_local_buf + 0xf));
    boost::asio::ip::
    basic_resolver<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::resolve((results_type *)
              &received.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
              (basic_resolver<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
               *)((long)&port_name.field_2 + 8),(query *)local_338);
    pbVar9 = boost::asio::ip::basic_resolver_iterator<boost::asio::ip::udp>::operator*
                       ((basic_resolver_iterator<boost::asio::ip::udp> *)
                        &received.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    boost::asio::ip::basic_resolver_entry<boost::asio::ip::udp>::basic_resolver_entry
              ((basic_resolver_entry<boost::asio::ip::udp> *)local_3c0,pbVar9);
    boost::asio::ip::basic_resolver_results<boost::asio::ip::udp>::~basic_resolver_results
              ((basic_resolver_results<boost::asio::ip::udp> *)
               &received.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &server.session_bindings._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"self_port",&local_4f1);
    pvVar7 = boost::program_options::variables_map::operator[](local_1a8,&local_4f0);
    puVar8 = boost::program_options::variable_value::as<unsigned_short>(pvVar7);
    p = *puVar8;
    s.session = (rudp_server *)
                &server.session_bindings._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::
    function<void(rudp::rudp_server&,unsigned_int,std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,256ul,void>>const&)>
    ::function<main::__0,void>
              ((function<void(rudp::rudp_server&,unsigned_int,std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,256ul,void>>const&)>
                *)&local_518,(anon_class_8_1_b7b80f5f *)&s.session);
    rudp::rudp_server::rudp_server
              ((rudp_server *)local_4d0,(io_service *)&resolver.impl_.executor_.prop_fns_,p,
               &local_518);
    std::
    function<void_(rudp::rudp_server_&,_unsigned_int,_const_std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>_&)>
    ::~function(&local_518);
    std::__cxx11::string::~string((string *)&local_4f0);
    std::allocator<char>::~allocator(&local_4f1);
    sender::sender((sender *)((long)&a.field_2 + 8),(rudp_server *)local_4d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_568,"abcde",&local_569);
    std::allocator<char>::~allocator(&local_569);
    boost::asio::ip::basic_resolver_entry::operator_cast_to_basic_endpoint
              (&local_588,(basic_resolver_entry *)local_3c0);
    iVar1._M_thread = (long)&a.field_2 + 8;
    local_5b0.s = (sender *)iVar1._M_thread;
    std::function<void(bool,unsigned_int)>::function<main::__1,void>
              ((function<void(bool,unsigned_int)> *)&local_5a8,&local_5b0);
    worker._M_id._M_thread = (id)(id)iVar1._M_thread;
    std::function<void()>::function<main::__2,void>
              ((function<void()> *)&local_5d0,(anon_class_16_2_99d30285 *)&worker);
    rudp::rudp_server::connect
              ((rudp_server *)local_4d0,(int)&local_588,(sockaddr *)&local_5a8,(socklen_t)&local_5d0
              );
    std::function<void_()>::~function(&local_5d0);
    std::function<void_(bool,_unsigned_int)>::~function(&local_5a8);
    local_5f0.io_service = (io_service *)&resolver.impl_.executor_.prop_fns_;
    std::thread::thread<main::__3,,void>(&local_5e8,&local_5f0);
    std::thread::join();
    std::thread::~thread(&local_5e8);
    std::__cxx11::string::~string(local_568);
    sender::~sender((sender *)((long)&a.field_2 + 8));
    rudp::rudp_server::~rudp_server((rudp_server *)local_4d0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               &server.session_bindings._M_t._M_impl.super__Rb_tree_header._M_node_count);
    boost::asio::ip::basic_resolver_entry<boost::asio::ip::udp>::~basic_resolver_entry
              ((basic_resolver_entry<boost::asio::ip::udp> *)local_3c0);
    boost::asio::ip::basic_resolver_query<boost::asio::ip::udp>::~basic_resolver_query
              ((basic_resolver_query<boost::asio::ip::udp> *)local_338);
    std::__cxx11::string::~string((string *)local_298);
    boost::asio::ip::
    basic_resolver<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
    ::~basic_resolver((basic_resolver<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                       *)((long)&port_name.field_2 + 8));
    boost::asio::io_context::~io_context((io_context *)&resolver.impl_.executor_.prop_fns_);
  }
  else {
    this = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,local_98);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  io_service.impl_._1_3_ = 0;
  io_service.impl_._0_1_ = sVar5 != 0;
  boost::program_options::variables_map::~variables_map(local_1a8);
  boost::program_options::options_description::~options_description(local_98);
  return 0;
}

Assistant:

int main( int argc, char *argv[] ) {
  namespace po = boost::program_options;
  po::options_description opts( "Options" );
  opts.add_options()
    ( "remote_port,r", po::value< uint16_t >()->default_value( 8000 ), "port" )
    ( "self_port,s", po::value< uint16_t >()->default_value( 8001 ), "port" )
    ( "host,H", po::value< std::string >()->default_value( "localhost" ), "host" )
    ( "help,h", "display this message" );
  po::variables_map values;
  po::store( po::parse_command_line( argc, argv, opts ), values );
  if( values.count("help") ) {
    std::cout << opts << std::endl;
    return 0;
  }
  srand( time( nullptr ) );
  boost::asio::io_service io_service;
  using boost::asio::ip::udp;
  udp::resolver resolver( io_service );
  std::string port_name;
  boost::spirit::karma::generate( std::back_inserter( port_name ), boost::spirit::karma::ushort_, values[ "remote_port" ].as< uint16_t >() );
  udp::resolver::query query( values[ "host" ].as< std::string >(), port_name );
  const auto remote_endpoint = *resolver.resolve( query );
  std::vector< uint8_t > received;
  rudp::rudp_server server( io_service, values[ "self_port" ].as< uint16_t >(),
    [&]( rudp::rudp_server&, uint32_t ident, const rudp::buffers_ptr_t &bufs ) {
      std::cout << "received" << std::endl;
      for( const auto &buf: *bufs ) {
        const auto header_size = (*buf)[ 1 ];
        received.insert( received.end(), std::next( buf->begin(), header_size ), buf->end() );
      }
    }
  );
  sender s( server );
  std::string a( "abcde" );
  server.connect( remote_endpoint, [&]( bool status, uint32_t identifier ) {
    if( status ) {
      std::cout << "connected" << std::endl;
      s( identifier );
    }
    else std::cout << "failed" << std::endl;
  },
  [&]() {
    std::cout << "closed" << std::endl;
    s.check( received );
  } );
  std::thread worker( [&]() { io_service.run(); } );
  worker.join();
}